

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

iterator * __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::begin
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          )

{
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_> local_40;
  
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::AdapterState
            (&local_40,&this->source);
  iterator::iterator(__return_storage_ptr__,&local_40,true);
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_40);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return iterator(source); }